

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowSize(char *name,ImVec2 *size,ImGuiSetCond cond)

{
  ImGuiWindow *window_00;
  ImGuiWindow *window;
  ImGuiSetCond cond_local;
  ImVec2 *size_local;
  char *name_local;
  
  window_00 = FindWindowByName(name);
  if (window_00 != (ImGuiWindow *)0x0) {
    ::SetWindowSize(window_00,size,cond);
  }
  return;
}

Assistant:

void ImGui::SetWindowSize(const char* name, const ImVec2& size, ImGuiSetCond cond)
{
    ImGuiWindow* window = FindWindowByName(name);
    if (window)
        SetWindowSize(window, size, cond);
}